

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O1

int cvHandleFailure(CVodeMem cv_mem,int flag)

{
  int iVar1;
  char *pcVar2;
  realtype rVar3;
  realtype rVar4;
  
  switch(flag) {
  case -0x1f:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg the projection function had repeated recoverable errors.";
    iVar1 = -0x1f;
    break;
  case -0x1e:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg the projection function failed with an unrecoverable error.";
    iVar1 = -0x1e;
    break;
  case -0x1d:
    pcVar2 = "proj_mem = NULL illegal.";
    iVar1 = -0x1d;
    goto LAB_00430be7;
  case -0x1c:
  case -0x1a:
  case -0x19:
  case -0x18:
  case -0x17:
  case -0x16:
  case -0x14:
  case -0x13:
  case -0x12:
  case -0x11:
  case -0xd:
  case -9:
  case -5:
    goto switchD_00430a46_caseD_ffffffe4;
  case -0x1b:
    pcVar2 = "tout too close to t0 to start integration.";
    iVar1 = -0x1b;
    goto LAB_00430be7;
  case -0x15:
    pcVar2 = "cvode_mem = NULL illegal.";
    cv_mem = (CVodeMem)0x0;
    iVar1 = -0x15;
    goto LAB_00430be7;
  case -0x10:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg, the nonlinear solver failed in an unrecoverable manner.";
    iVar1 = -0x10;
    break;
  case -0xf:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg, unable to satisfy inequality constraints.";
    iVar1 = -0xf;
    break;
  case -0xe:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg, the nonlinear solver setup failed unrecoverably.";
    iVar1 = -0xe;
    break;
  case -0xc:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
    iVar1 = -0xc;
    break;
  case -0xb:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = 
    "At t = %lg, the right-hand side failed in a recoverable manner, but no recovery is possible.";
    iVar1 = -0xb;
    break;
  case -10:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg repeated recoverable right-hand side function errors.";
    iVar1 = -10;
    break;
  case -8:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg, the right-hand side routine failed in an unrecoverable manner.";
    iVar1 = -8;
    break;
  case -7:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg, the solve routine failed in an unrecoverable manner.";
    iVar1 = -7;
    break;
  case -6:
    rVar3 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg, the setup routine failed in an unrecoverable manner.";
    iVar1 = -6;
    break;
  case -4:
    rVar3 = cv_mem->cv_h;
    rVar4 = cv_mem->cv_tn;
    pcVar2 = 
    "At t = %lg and h = %lg, the corrector convergence test failed repeatedly or with |h| = hmin.";
    iVar1 = -4;
    goto LAB_00430d04;
  case -3:
    rVar3 = cv_mem->cv_h;
    rVar4 = cv_mem->cv_tn;
    pcVar2 = "At t = %lg and h = %lg, the error test failed repeatedly or with |h| = hmin.";
    iVar1 = -3;
LAB_00430d04:
    cvProcessError(cv_mem,iVar1,"CVODE","CVode",pcVar2,rVar4,rVar3);
    return flag;
  default:
    if (flag == -0x385) {
      rVar3 = cv_mem->cv_tn;
      pcVar2 = "At t = %lg, the nonlinear solver was passed a NULL input.";
      iVar1 = -0x15;
      break;
    }
    goto switchD_00430a46_caseD_ffffffe4;
  }
  cvProcessError(cv_mem,iVar1,"CVODE","CVode",pcVar2,rVar3);
  return flag;
switchD_00430a46_caseD_ffffffe4:
  pcVar2 = 
  "CVODE encountered an unrecognized error. Please report this to the SUNDIALS developers at sundials-users@llnl.gov"
  ;
  flag = -99;
  iVar1 = -99;
LAB_00430be7:
  cvProcessError(cv_mem,iVar1,"CVODE","CVode",pcVar2);
  return flag;
}

Assistant:

static int cvHandleFailure(CVodeMem cv_mem, int flag)
{

  /* Set vector of  absolute weighted local errors */
  /*
  N_VProd(acor, ewt, tempv);
  N_VAbs(tempv, tempv);
  */

  /* Depending on flag, print error message and return error flag */
  switch (flag) {
  case CV_ERR_FAILURE:
    cvProcessError(cv_mem, CV_ERR_FAILURE, "CVODE", "CVode",
                   MSGCV_ERR_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_CONV_FAILURE:
    cvProcessError(cv_mem, CV_CONV_FAILURE, "CVODE", "CVode",
                   MSGCV_CONV_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_LSETUP_FAIL:
    cvProcessError(cv_mem, CV_LSETUP_FAIL, "CVODE", "CVode",
                   MSGCV_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_LSOLVE_FAIL:
    cvProcessError(cv_mem, CV_LSOLVE_FAIL, "CVODE", "CVode",
                   MSGCV_SOLVE_FAILED, cv_mem->cv_tn);
    break;
  case CV_RHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_RHSFUNC_FAIL, "CVODE", "CVode",
                   MSGCV_RHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_RHSFUNC_ERR, "CVODE", "CVode",
                   MSGCV_RHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_RHSFUNC_ERR, "CVODE", "CVode",
                   MSGCV_RHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_RTFUNC_FAIL:
    cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "CVode",
                   MSGCV_RTFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_TOO_CLOSE:
    cvProcessError(cv_mem, CV_TOO_CLOSE, "CVODE", "CVode",
                   MSGCV_TOO_CLOSE);
    break;
  case CV_MEM_NULL:
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVode",
                   MSGCV_NO_MEM);
    break;
  case SUN_NLS_MEM_NULL:
    cvProcessError(cv_mem, CV_MEM_NULL, "CVODE", "CVode",
                   MSGCV_NLS_INPUT_NULL, cv_mem->cv_tn);
    break;
  case CV_NLS_SETUP_FAIL:
    cvProcessError(cv_mem, CV_NLS_SETUP_FAIL, "CVODE", "CVode",
                   MSGCV_NLS_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_CONSTR_FAIL:
    cvProcessError(cv_mem, CV_CONSTR_FAIL, "CVODE", "CVode",
                   MSGCV_FAILED_CONSTR, cv_mem->cv_tn);
    break;
  case CV_NLS_FAIL:
    cvProcessError(cv_mem, CV_NLS_FAIL, "CVODE", "CVode",
                   MSGCV_NLS_FAIL, cv_mem->cv_tn);
    break;
  case CV_PROJ_MEM_NULL:
    cvProcessError(cv_mem, CV_PROJ_MEM_NULL, "CVODE", "CVode",
                   MSG_CV_PROJ_MEM_NULL);
    break;
  case CV_PROJFUNC_FAIL:
    cvProcessError(cv_mem, CV_PROJFUNC_FAIL, "CVODE", "CVode",
                   MSG_CV_PROJFUNC_FAIL, cv_mem->cv_tn);
    break;
  case CV_REPTD_PROJFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_PROJFUNC_ERR, "CVODE", "CVode",
                   MSG_CV_REPTD_PROJFUNC_ERR, cv_mem->cv_tn);
    break;
  default:
    /* This return should never happen */
    cvProcessError(cv_mem, CV_UNRECOGNIZED_ERR, "CVODE", "CVode",
                   "CVODE encountered an unrecognized error. Please report this to the SUNDIALS developers at sundials-users@llnl.gov");
    return (CV_UNRECOGNIZED_ERR);
  }

  return(flag);
}